

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmatch.cpp
# Opt level: O2

bool __thiscall Lmatch::getMatch(Lmatch *this,Pattern *pg,Graph *dg,Graph *dest)

{
  pointer psVar1;
  pointer psVar2;
  pointer piVar3;
  __type _Var4;
  int iVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  pointer pNVar8;
  ostream *poVar9;
  pointer pNVar10;
  int i;
  long lVar11;
  long lVar12;
  long lVar13;
  size_type __n;
  int i_1;
  size_type sVar14;
  Graph *pGVar15;
  Node *node;
  reference rVar16;
  allocator_type local_26a;
  allocator_type local_269;
  Graph *local_268;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  edgeMatch;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> q;
  Kmatrix km;
  vector<bool,_std::allocator<bool>_> nodeMatch;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  string local_150;
  string local_130;
  Node local_110;
  string local_d0;
  Node local_b0;
  Node local_70;
  
  km.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  km.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  km.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = Pattern::getT(pg);
  Kmatrix::calMatrix(&km,&pg->super_Graph,dg,iVar5);
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &nodes._M_t._M_impl.super__Rb_tree_header._M_header;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p.first = p.first & 0xffffff00;
  local_268 = dg;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&nodeMatch,
             (long)(int)((ulong)((long)(pg->super_Graph).nodes.
                                       super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pg->super_Graph).nodes.
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 6),(bool *)&p,
             (allocator_type *)&q);
  sVar14 = (size_type)
           (int)((ulong)((long)(pg->super_Graph).nodes.
                               super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pg->super_Graph).nodes.
                              super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 6);
  q.first = CONCAT31(q.first._1_3_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&p,sVar14,(bool *)&q,&local_269);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&edgeMatch,sVar14,(value_type *)&p,&local_26a);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&p);
  lVar11 = 0;
  while( true ) {
    pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar8 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6) <= lVar11) break;
    psVar1 = (pg->super_Graph).edges.
             super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var6 = *(_Base_ptr *)((long)&psVar1[lVar11]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var6 != &psVar1[lVar11]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair(&p,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var6 + 1));
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (edgeMatch.
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar11,(long)p.first);
      *rVar16._M_p = *rVar16._M_p & ~rVar16._M_mask;
      std::__cxx11::string::~string((string *)&p.second);
    }
    lVar11 = lVar11 + 1;
  }
  for (lVar11 = 0; lVar11 < (int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6); lVar11 = lVar11 + 1)
  {
    if ((pg->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] == -1) {
      iVar5 = Pattern::getT(pg);
      (pg->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = iVar5 + 1;
      pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar8 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  for (sVar14 = 0; (long)sVar14 < (long)(int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6);
      sVar14 = sVar14 + 1) {
    for (p.first = 0;
        p.first < (int)((ulong)((long)(local_268->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(local_268->nodes).
                                     super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 6); p.first = p.first + 1)
    {
      if ((pg->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[sVar14] <=
          km.M.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar14].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [p.first]) {
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&nodeMatch,sVar14);
        *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &nodes,&p.first);
      }
    }
    pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar8 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (p_Var6 = nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &nodes._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    Graph::insertNode(dest,(local_268->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                           _M_impl.super__Vector_impl_data._M_start + (int)p_Var6[1]._M_color);
  }
  lVar11 = 0;
  pGVar15 = local_268;
  while( true ) {
    pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar8 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6) <= lVar11) break;
    psVar1 = (pg->super_Graph).edges.
             super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var7 = *(_Base_ptr *)((long)&psVar1[lVar11]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var7 != &psVar1[lVar11]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair(&p,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var7 + 1));
      for (lVar12 = 0;
          lVar12 < (int)((ulong)((long)(pGVar15->nodes).
                                       super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pGVar15->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 6); lVar12 = lVar12 + 1)
      {
        psVar2 = (pGVar15->edges).
                 super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (p_Var6 = *(_Base_ptr *)
                       ((long)&psVar2[lVar12]._M_t._M_impl.super__Rb_tree_header + 0x10);
            p_Var6 != &psVar2[lVar12]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair(&q,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(p_Var6 + 1));
          piVar3 = (pg->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((piVar3[lVar11] <=
               km.M.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar12]) &&
             (piVar3[p.first] <=
              km.M.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[p.first].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [q.first])) {
            _Var4 = std::operator==(&p.second,&q.second);
            if (_Var4) {
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (edgeMatch.
                                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar11,(long)p.first);
              pGVar15 = local_268;
              *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
              std::__cxx11::string::string
                        ((string *)&local_130,
                         (string *)
                         ((local_268->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                          .super__Vector_impl_data._M_start + lVar12));
              std::__cxx11::string::string
                        ((string *)&local_150,
                         (string *)
                         ((pGVar15->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_start + q.first));
              std::__cxx11::string::string((string *)&local_d0,(string *)&q.second);
              Graph::insertEdge(dest,&local_130,&local_150,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_130);
            }
          }
          std::__cxx11::string::~string((string *)&q.second);
        }
        pGVar15 = local_268;
      }
      std::__cxx11::string::~string((string *)&p.second);
    }
    lVar11 = lVar11 + 1;
  }
  sVar14 = 0;
  do {
    lVar11 = (long)(int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6);
    if (lVar11 <= (long)sVar14) {
LAB_0010973a:
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&edgeMatch);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&nodeMatch.super__Bvector_base<std::allocator<bool>_>);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&nodes._M_t);
      Kmatrix::~Kmatrix(&km);
      return lVar11 <= (long)sVar14;
    }
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&nodeMatch,sVar14);
    if ((*rVar16._M_p & rVar16._M_mask) == 0) {
      Node::Node(&local_70,
                 (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar14);
      node = &local_70;
      poVar9 = operator<<((ostream *)&std::cout,node);
      std::endl<char,std::char_traits<char>>(poVar9);
LAB_00109732:
      Node::~Node(node);
      goto LAB_0010973a;
    }
    __n = 0;
    lVar12 = -0x40;
    while( true ) {
      lVar13 = lVar12;
      pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar8 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)(int)((ulong)((long)pNVar8 - (long)pNVar10) >> 6) <= (long)__n) break;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (edgeMatch.
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + sVar14,__n);
      __n = __n + 1;
      lVar12 = lVar13 + 0x40;
      if ((*rVar16._M_p & rVar16._M_mask) == 0) {
        Node::Node(&local_b0,
                   (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar14);
        node = &local_b0;
        poVar9 = operator<<((ostream *)&std::cout,node);
        poVar9 = std::operator<<(poVar9," --->>> ");
        Node::Node(&local_110,
                   (Node *)((long)&(pg->super_Graph).nodes.
                                   super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                   super__Vector_impl_data._M_start[1].id._M_dataplus._M_p + lVar13)
                  );
        poVar9 = operator<<(poVar9,&local_110);
        std::endl<char,std::char_traits<char>>(poVar9);
        Node::~Node(&local_110);
        goto LAB_00109732;
      }
    }
    sVar14 = sVar14 + 1;
  } while( true );
}

Assistant:

bool Lmatch::getMatch(Pattern &pg, Graph &dg, Graph &dest) {
    Kmatrix km;

    km.calMatrix(pg, dg, pg.getT());

    set<int> nodes;

    vector<bool> nodeMatch(pg.nodeNum(), false);
    vector<vector<bool>> edgeMatch(pg.nodeNum(), vector<bool>(pg.nodeNum(), true));
    for (int i = 0; i < pg.nodeNum(); i++) {
        for (auto p : pg.edges[i])
            edgeMatch[i][p.first] = false;
    }

    for (int i = 0; i < pg.nodeNum(); i++)
        if (pg.weight[i] == -1)
            pg.weight[i] = pg.getT() + 1;

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (int j = 0; j < dg.nodeNum(); j++) {
            if (km.M[i][j] >= pg.weight[i]) {
                nodeMatch[i] = true;
                nodes.insert(j);
            }
        }
    }

    for (int i : nodes) {
        dest.insertNode(dg.nodes[i]);
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (pair<int, string> p : pg.edges[i]) {
            for (int j = 0; j < dg.nodeNum(); j++) {
                for (pair<int, string> q : dg.edges[j]) {
                    if (km.M[i][j] >= pg.weight[i] && km.M[p.first][q.first] >= pg.weight[p.first]
                            && p.second == q.second) {
                        edgeMatch[i][p.first] = true;
                        dest.insertEdge(dg.nodes[j].id, dg.nodes[q.first].id, q.second);
                    }
                }
            }
        }
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        if (nodeMatch[i] == false) {
            cout << pg.nodes[i] << endl;
            return false;
        }
        for (int j = 0; j < pg.nodeNum(); j++) {
            if (edgeMatch[i][j] == false) {
                cout << pg.nodes[i] << " --->>> " << pg.nodes[j] << endl;
                return false;
            }
        }
    }
    return true;
}